

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageIO.cpp
# Opt level: O1

void tcu::ImageIO::loadImage(TextureLevel *dst,Archive *archive,char *fileName)

{
  int iVar1;
  InternalError *this;
  string ext;
  allocator<char> local_61;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,fileName,&local_61);
  de::FilePath::getFileExtension_abi_cxx11_(&local_60,(FilePath *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_60);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar1 != 0) {
      this = (InternalError *)__cxa_allocate_exception(0x38);
      InternalError::InternalError
                (this,"Unrecognized image file extension",fileName,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
                 ,0x3e);
      __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
    }
  }
  loadPNG(dst,archive,fileName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void loadImage (TextureLevel& dst, const tcu::Archive& archive, const char* fileName)
{
	string ext = de::FilePath(fileName).getFileExtension();

	if (ext == "png" || ext == "PNG")
		loadPNG(dst, archive, fileName);
	else
		throw InternalError("Unrecognized image file extension", fileName, __FILE__, __LINE__);
}